

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

spv_result_t
spvtools::anon_unknown_0::DisassembleTargetInstruction
          (void *user_data,spv_parsed_instruction_t *parsed_instruction)

{
  bool bVar1;
  spv_result_t sVar2;
  
  if (user_data != (void *)0x0) {
    sVar2 = SPV_SUCCESS;
    if (*(uint **)((long)user_data + 0x10) == (uint *)(ulong)parsed_instruction->num_words) {
      bVar1 = std::__equal<true>::equal<unsigned_int>
                        (*(__equal<true> **)((long)user_data + 8),
                         (uint *)(*(__equal<true> **)((long)user_data + 8) +
                                 (long)*(uint **)((long)user_data + 0x10) * 4),
                         parsed_instruction->words,(uint *)(ulong)parsed_instruction->num_words);
      if (bVar1) {
        Disassembler::HandleInstruction(*user_data,parsed_instruction);
        sVar2 = SPV_REQUESTED_TERMINATION;
      }
    }
    return sVar2;
  }
  __assert_fail("user_data",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                ,0x246,
                "spv_result_t spvtools::(anonymous namespace)::DisassembleTargetInstruction(void *, const spv_parsed_instruction_t *)"
               );
}

Assistant:

spv_result_t DisassembleTargetInstruction(
    void* user_data, const spv_parsed_instruction_t* parsed_instruction) {
  assert(user_data);
  auto wrapped = static_cast<WrappedDisassembler*>(user_data);
  // Check if this is the instruction we want to disassemble.
  if (wrapped->word_count() == parsed_instruction->num_words &&
      std::equal(wrapped->inst_binary(),
                 wrapped->inst_binary() + wrapped->word_count(),
                 parsed_instruction->words)) {
    // Found the target instruction. Disassemble it and signal that we should
    // stop searching so we don't output the same instruction again.
    if (auto error =
            wrapped->disassembler()->HandleInstruction(*parsed_instruction))
      return error;
    return SPV_REQUESTED_TERMINATION;
  }
  return SPV_SUCCESS;
}